

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O2

void __thiscall mocker::ir::Builder::operator()(Builder *this,FuncDecl *node)

{
  char cVar1;
  pointer psVar2;
  BuilderContext *pBVar3;
  element_type *peVar4;
  pointer psVar5;
  element_type *peVar6;
  bool bVar7;
  char *pcVar8;
  BBLIter BVar9;
  long lVar10;
  ulong uVar11;
  shared_ptr<mocker::ast::Statement> *p;
  pointer psVar12;
  shared_ptr<mocker::ast::VarDeclStmt> *param;
  pointer psVar13;
  shared_ptr<mocker::ir::Reg> reg_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  paramIdent;
  shared_ptr<mocker::ir::Reg> reg;
  shared_ptr<mocker::ir::Reg> local_268;
  shared_ptr<mocker::ir::Reg> local_258;
  FunctionModule *local_240;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_238;
  shared_ptr<mocker::ir::IRInst> local_218;
  ulong local_208;
  long local_200;
  shared_ptr<mocker::ir::Reg> local_1f8 [2];
  shared_ptr<mocker::ir::IRInst> local_1d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c8;
  string local_1a8 [32];
  string local_188 [32];
  string local_168;
  string local_148;
  string local_128 [32];
  FunctionModule local_108;
  
  pcVar8 = (char *)std::__cxx11::string::at
                             ((ulong)&((node->identifier).
                                       super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr)->val);
  cVar1 = *pcVar8;
  local_238.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_238.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_238.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (cVar1 == '#') {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[5]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_238,
               (char (*) [5])"this");
  }
  psVar2 = (node->formalParameters).
           super__Vector_base<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar13 = (node->formalParameters).
                 super__Vector_base<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; psVar13 != psVar2; psVar13 = psVar13 + 1
      ) {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_238,
               &((((psVar13->
                   super___shared_ptr<mocker::ast::VarDeclStmt,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                 ->identifier).
                 super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                val);
  }
  pBVar3 = this->ctx;
  std::__cxx11::string::string
            ((string *)&local_168,
             (string *)
             &((node->identifier).
               super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->val)
  ;
  local_1c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_238.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_1c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_238.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_1c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_238.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_238.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_238.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_238.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  FunctionModule::FunctionModule(&local_108,&local_168,&local_1c8,false);
  local_240 = BuilderContext::addFunc(pBVar3,&local_108);
  FunctionModule::~FunctionModule(&local_108);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1c8);
  std::__cxx11::string::~string((string *)&local_168);
  BuilderContext::initFuncCtx
            (this->ctx,
             (long)(node->formalParameters).
                   super__Vector_base<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(node->formalParameters).
                   super__Vector_base<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4);
  pBVar3 = this->ctx;
  BVar9 = FunctionModule::pushBackBB(local_240);
  BuilderContext::setCurBasicBlock(pBVar3,BVar9);
  if (cVar1 == '#') {
    std::__cxx11::string::string<std::allocator<char>>
              (local_188,"this",(allocator<char> *)&local_268);
    makeReg((Builder *)local_1f8,(string *)this);
    std::__cxx11::string::~string(local_188);
    pBVar3 = this->ctx;
    BVar9._M_node =
         (local_240->bbs).
         super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>._M_impl.
         _M_node.super__List_node_base._M_next;
    std::make_shared<mocker::ir::Alloca,std::shared_ptr<mocker::ir::Reg>&>(&local_268);
    local_1d8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         local_268.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_1d8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         local_268.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    local_268.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_268.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    BuilderContext::appendInstFront(pBVar3,BVar9,&local_1d8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_1d8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_268.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    pBVar3 = this->ctx;
    std::__cxx11::string::string<std::allocator<char>>(local_1a8,"0",(allocator<char> *)&local_258);
    makeReg((Builder *)&local_268,(string *)this);
    BuilderContext::
    emplaceInst<mocker::ir::Store,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::Reg>>
              (pBVar3,local_1f8,&local_268);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_268.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__cxx11::string::~string(local_1a8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_1f8[0].super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  local_208 = (ulong)(cVar1 == '#');
  lVar10 = 0;
  uVar11 = 0;
  while( true ) {
    psVar13 = (node->formalParameters).
              super__Vector_base<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(node->formalParameters).
                      super__Vector_base<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)psVar13 >> 4) <= uVar11)
    break;
    local_200 = lVar10;
    std::__cxx11::string::string
              ((string *)local_1f8,
               (string *)
               (*(long *)(*(long *)((long)&(psVar13->
                                           super___shared_ptr<mocker::ast::VarDeclStmt,_(__gnu_cxx::_Lock_policy)2>
                                           )._M_ptr + lVar10) + 0x28) + 0x18));
    std::__cxx11::string::string(local_128,(string *)local_1f8);
    makeReg((Builder *)&local_268,(string *)this);
    std::__cxx11::string::~string(local_128);
    pBVar3 = this->ctx;
    BVar9._M_node =
         (local_240->bbs).
         super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>._M_impl.
         _M_node.super__List_node_base._M_next;
    std::make_shared<mocker::ir::Alloca,std::shared_ptr<mocker::ir::Reg>&>(&local_258);
    local_218.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         local_258.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_218.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         local_258.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    local_258.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_258.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    BuilderContext::appendInstFront(pBVar3,BVar9,&local_218);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_218.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_258.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    pBVar3 = this->ctx;
    std::__cxx11::to_string(&local_148,local_208 + uVar11);
    makeReg((Builder *)&local_258,(string *)this);
    BuilderContext::
    emplaceInst<mocker::ir::Store,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::Reg>>
              (pBVar3,&local_268,&local_258);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_258.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__cxx11::string::~string((string *)&local_148);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_268.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__cxx11::string::~string((string *)local_1f8);
    uVar11 = uVar11 + 1;
    lVar10 = local_200 + 0x10;
  }
  peVar4 = (node->body).super___shared_ptr<mocker::ast::CompoundStmt,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  psVar5 = (peVar4->stmts).
           super__Vector_base<std::shared_ptr<mocker::ast::Statement>,_std::allocator<std::shared_ptr<mocker::ast::Statement>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar12 = (peVar4->stmts).
                 super__Vector_base<std::shared_ptr<mocker::ast::Statement>,_std::allocator<std::shared_ptr<mocker::ast::Statement>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; psVar12 != psVar5; psVar12 = psVar12 + 1
      ) {
    BVar9 = BuilderContext::getCurBasicBlock(this->ctx);
    bVar7 = BasicBlock::isCompleted((BasicBlock *)(BVar9._M_node + 1));
    if (bVar7) goto LAB_0013af30;
    peVar6 = (psVar12->super___shared_ptr<mocker::ast::Statement,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    (*(peVar6->super_ASTNode)._vptr_ASTNode[3])
              (peVar6,&this->field_0x0 + *(long *)(*(long *)this + -0xf0));
  }
  BVar9 = BuilderContext::getCurBasicBlock(this->ctx);
  bVar7 = BasicBlock::isCompleted((BasicBlock *)(BVar9._M_node + 1));
  if (!bVar7) {
    BuilderContext::emplaceInst<mocker::ir::Ret>(this->ctx);
  }
LAB_0013af30:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_238);
  return;
}

Assistant:

void Builder::operator()(const ast::FuncDecl &node) const {
  bool isMember = node.identifier->val.at(0) == '#';
  std::vector<std::string> paramIdent;
  if (isMember)
    paramIdent.emplace_back("this");
  for (auto &param : node.formalParameters)
    paramIdent.emplace_back(param->identifier->val);

  auto &func =
      ctx.addFunc(FunctionModule(node.identifier->val, std::move(paramIdent)));
  ctx.initFuncCtx(node.formalParameters.size());
  ctx.setCurBasicBlock(func.pushBackBB());

  if (isMember) {
    auto reg = makeReg("this");
    ctx.appendInstFront(func.getFirstBB(), std::make_shared<Alloca>(reg));
    ctx.emplaceInst<Store>(reg, makeReg("0"));
  }
  for (std::size_t i = 0; i < node.formalParameters.size(); ++i) {
    auto name = node.formalParameters[i]->identifier->val;
    auto reg = makeReg(name);
    ctx.appendInstFront(func.getFirstBB(), std::make_shared<Alloca>(reg));
    ctx.emplaceInst<Store>(reg, makeReg(std::to_string(i + isMember)));
  }

  for (auto &p : node.body->stmts) {
    if (ctx.getCurBasicBlock()->isCompleted())
      return;
    visit(*p);
  }
  if (!ctx.getCurBasicBlock()->isCompleted())
    ctx.emplaceInst<Ret>();
}